

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Cnf_Dat_t * Jf_ManCreateCnf(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas)

{
  int iVar1;
  Cnf_Dat_t *pCVar2;
  int **ppiVar3;
  int *piVar4;
  int iOut;
  int Entry;
  int i;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vClas_local;
  Vec_Int_t *vLits_local;
  Gia_Man_t *p_local;
  
  pCVar2 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar2->pMan = (Aig_Man_t *)p;
  iVar1 = Gia_ManObjNum(p);
  pCVar2->nVars = iVar1;
  iVar1 = Vec_IntSize(vLits);
  pCVar2->nLiterals = iVar1;
  iVar1 = Vec_IntSize(vClas);
  pCVar2->nClauses = iVar1;
  ppiVar3 = (int **)malloc((long)(pCVar2->nClauses + 1) << 3);
  pCVar2->pClauses = ppiVar3;
  piVar4 = Vec_IntReleaseArray(vLits);
  *pCVar2->pClauses = piVar4;
  for (iOut = 0; iVar1 = Vec_IntSize(vClas), iOut < iVar1; iOut = iOut + 1) {
    iVar1 = Vec_IntEntry(vClas,iOut);
    pCVar2->pClauses[iOut] = *pCVar2->pClauses + iVar1;
  }
  pCVar2->pClauses[iOut] = *pCVar2->pClauses + pCVar2->nLiterals;
  iVar1 = Gia_ManObjNum(p);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(piVar4,0xff,(long)iVar1 << 2);
  pCVar2->pObj2Clause = piVar4;
  iVar1 = Gia_ManObjNum(p);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(piVar4,0xff,(long)iVar1 << 2);
  pCVar2->pObj2Count = piVar4;
  iOut = 0;
  do {
    if (pCVar2->nClauses <= iOut) {
      return pCVar2;
    }
    iVar1 = Abc_Lit2Var(*pCVar2->pClauses[iOut]);
    if (pCVar2->pObj2Clause[iVar1] == -1) {
      pCVar2->pObj2Clause[iVar1] = iOut;
      pCVar2->pObj2Count[iVar1] = 1;
    }
    else {
      if (pCVar2->pObj2Count[iVar1] < 1) {
        __assert_fail("pCnf->pObj2Count[iOut] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0xe2,"Cnf_Dat_t *Jf_ManCreateCnf(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      pCVar2->pObj2Count[iVar1] = pCVar2->pObj2Count[iVar1] + 1;
    }
    iOut = iOut + 1;
  } while( true );
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnf( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas )
{
    Cnf_Dat_t * pCnf; 
    int i, Entry, iOut;
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = Gia_ManObjNum(p);
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    // create mapping of objects into their clauses
    pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        iOut = Abc_Lit2Var(pCnf->pClauses[i][0]);
        if ( pCnf->pObj2Clause[iOut] == -1 )
        {
            pCnf->pObj2Clause[iOut] = i;
            pCnf->pObj2Count[iOut] = 1;
        }
        else
        {
            assert( pCnf->pObj2Count[iOut] > 0 );
            pCnf->pObj2Count[iOut]++;
        }
    }
    return pCnf;
}